

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

void __thiscall cfd::core::Block::Block(Block *this,ByteData *data)

{
  uint32_t uVar1;
  int iVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  initializer_list<unsigned_int> __l;
  ByteData txs;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> arr;
  Deserializer dec;
  Transaction tx;
  ByteData tx_data;
  allocator_type local_129;
  ByteData local_128;
  Txid local_110;
  BlockHeader *local_f0;
  _func_int **local_e8;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *local_e0;
  vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *local_d8;
  uint local_d0;
  int local_cc;
  Deserializer local_c8;
  Transaction local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  ByteData local_48;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_00259a78;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,&data->data_);
  (this->header_).version = 0;
  (this->header_).prev_block_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00259aa8;
  ByteData::ByteData(&(this->header_).prev_block_hash.data_);
  (this->header_).merkle_root_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00259aa8;
  ByteData::ByteData(&(this->header_).merkle_root_hash.data_);
  local_f0 = &this->header_;
  (this->header_).time = 0;
  (this->header_).bits = 0;
  (this->header_).nonce = 0;
  local_d8 = (vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&this->txs_;
  local_e0 = &this->txids_;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::Deserializer(&local_c8,data);
  uVar1 = Deserializer::ReadUint32(&local_c8);
  local_f0->version = uVar1;
  Deserializer::ReadBuffer(&local_128.data_,&local_c8,0x20);
  ByteData256::ByteData256((ByteData256 *)&local_110,&local_128.data_);
  BlockHash::BlockHash((BlockHash *)&local_a0,(ByteData256 *)&local_110);
  BlockHash::operator=(&(this->header_).prev_block_hash,(BlockHash *)&local_a0);
  local_a0.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__BlockHash_00259aa8;
  if (local_a0.super_AbstractTransaction.wally_tx_pointer_ != (void *)0x0) {
    operator_delete(local_a0.super_AbstractTransaction.wally_tx_pointer_);
  }
  if (local_110._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_110._vptr_Txid);
  }
  if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Deserializer::ReadBuffer(&local_128.data_,&local_c8,0x20);
  ByteData256::ByteData256((ByteData256 *)&local_110,&local_128.data_);
  BlockHash::BlockHash((BlockHash *)&local_a0,(ByteData256 *)&local_110);
  BlockHash::operator=(&(this->header_).merkle_root_hash,(BlockHash *)&local_a0);
  local_a0.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__BlockHash_00259aa8;
  if (local_a0.super_AbstractTransaction.wally_tx_pointer_ != (void *)0x0) {
    operator_delete(local_a0.super_AbstractTransaction.wally_tx_pointer_);
  }
  if (local_110._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_110._vptr_Txid);
  }
  if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar1 = Deserializer::ReadUint32(&local_c8);
  (this->header_).time = uVar1;
  uVar1 = Deserializer::ReadUint32(&local_c8);
  (this->header_).bits = uVar1;
  uVar1 = Deserializer::ReadUint32(&local_c8);
  (this->header_).nonce = uVar1;
  uVar3 = Deserializer::ReadVariableInt(&local_c8);
  sVar4 = ByteData::GetDataSize(data);
  uVar1 = Deserializer::GetReadSize(&local_c8);
  Deserializer::ReadBuffer
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,&local_c8,
             (int)sVar4 - uVar1);
  ByteData::ByteData(&local_128,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  if (local_a0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    operator_delete(local_a0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (uVar3 != 0) {
    local_e8 = (_func_int **)&PTR__Txid_00259ad8;
    do {
      Transaction::Transaction(&local_a0,&local_128);
      AbstractTransaction::GetData(&local_48,&local_a0.super_AbstractTransaction);
      sVar4 = ByteData::GetDataSize(&local_48);
      sVar5 = ByteData::GetDataSize(&local_128);
      iVar2 = (int)sVar5 - (uint)sVar4;
      if (iVar2 != 0) {
        __l._M_len = 2;
        __l._M_array = &local_d0;
        local_d0 = (uint)sVar4;
        local_cc = iVar2;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__l,&local_129)
        ;
        ByteData::SplitData((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                            &local_110,&local_128,&local_60);
        if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (local_110._vptr_Txid + 3));
        ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_110);
      }
      ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
      emplace_back<cfd::core::ByteData&>(local_d8,&local_48);
      AbstractTransaction::GetTxid(&local_110,&local_a0.super_AbstractTransaction);
      ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::
      emplace_back<cfd::core::Txid>(local_e0,&local_110);
      local_110._vptr_Txid = local_e8;
      if (local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Transaction::~Transaction(&local_a0);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (local_128.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_c8._vptr_Deserializer = (_func_int **)&PTR__Deserializer_00259898;
  if (local_c8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Block::Block(const ByteData& data) : data_(data) {
  Deserializer dec(data);
  header_.version = dec.ReadUint32();
  header_.prev_block_hash = BlockHash(dec.ReadBuffer(32));
  header_.merkle_root_hash = BlockHash(dec.ReadBuffer(32));
  header_.time = dec.ReadUint32();
  header_.bits = dec.ReadUint32();
  header_.nonce = dec.ReadUint32();
  uint64_t tx_count = dec.ReadVariableInt();
  size_t read_size = data.GetDataSize() - dec.GetReadSize();
  auto txs = ByteData(dec.ReadBuffer(static_cast<uint32_t>(read_size)));
  for (uint64_t index = 0; index < tx_count; ++index) {
    Transaction tx(txs);
    auto tx_data = tx.GetData();
    uint32_t cur_size = static_cast<uint32_t>(tx_data.GetDataSize());
    uint32_t unread_size = static_cast<uint32_t>(txs.GetDataSize()) - cur_size;
    if (unread_size != 0) {
      auto arr = txs.SplitData(std::vector<uint32_t>{cur_size, unread_size});
      txs = arr[1];
    }
    txs_.emplace_back(tx_data);
    txids_.emplace_back(tx.GetTxid());
  }
}